

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall
mocker::detail::RegisterAllocator::rewriteProgram
          (RegisterAllocator *this,
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          *toBeSpilled)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<std::shared_ptr<mocker::nasm::Register>_> *this_01;
  __node_base_ptr *this_02;
  Section *pSVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  OpType OVar5;
  string *__lhs;
  __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  string *__rhs;
  element_type *peVar6;
  element_type *this_04;
  size_type sVar7;
  size_type sVar8;
  shared_ptr<mocker::nasm::NumericConstant> *psVar9;
  shared_ptr<mocker::nasm::Register> *__args_1;
  const_reference __k;
  mapped_type *pmVar10;
  const_iterator __first;
  const_iterator __last;
  pointer pLVar11;
  reference __args;
  element_type *peVar12;
  mapped_type *this_05;
  reference x;
  shared_ptr<mocker::nasm::MemoryAddr> *__args_1_00;
  LineIter LVar13;
  Line local_460;
  LineIter local_430;
  reference local_428;
  Line *line;
  iterator __end2;
  iterator __begin2;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *__range2;
  bool flag;
  undefined1 local_3e8 [8];
  shared_ptr<mocker::nasm::Mov> storeBack;
  shared_ptr<mocker::nasm::Register> *reg_3;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range3_2;
  shared_ptr<mocker::nasm::Inst> newInst;
  shared_ptr<mocker::nasm::Mov> load;
  shared_ptr<mocker::nasm::Register> *reg_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range3_1;
  __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_338;
  shared_ptr<mocker::nasm::Register> *reg_1;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range3;
  RegMap<Node> mp;
  shared_ptr<mocker::nasm::Inst> inst_2;
  undefined1 local_2a0 [8];
  RegSet s;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> lines;
  anon_class_8_1_7726072b newVReg;
  size_t vRegCnt;
  shared_ptr<mocker::nasm::MemoryAddr> local_238;
  ulong local_228;
  size_t sz;
  size_t i;
  allocator<char> local_201;
  string local_200;
  Line local_1e0;
  LineIter local_1b0;
  shared_ptr<mocker::nasm::NumericConstant> local_1a8;
  undefined1 local_194 [12];
  shared_ptr<mocker::nasm::BinaryInst> newSubRsp_1;
  int64_t alignSz_1;
  string local_168;
  Line local_148;
  LineIter local_118;
  shared_ptr<mocker::nasm::NumericConstant> local_110;
  undefined1 local_fc [12];
  shared_ptr<mocker::nasm::BinaryInst> newSubRsp;
  LineIter pos;
  string label;
  int64_t alignSz;
  undefined1 local_a0 [8];
  shared_ptr<mocker::nasm::BinaryInst> inst_1;
  RegMap<std::shared_ptr<nasm::MemoryAddr>_> offsets;
  size_t baseOffset;
  shared_ptr<mocker::nasm::Register> reg;
  undefined1 local_30 [8];
  shared_ptr<mocker::nasm::BinaryInst> inst;
  LineIter iter;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *toBeSpilled_local;
  RegisterAllocator *this_local;
  
  std::_List_const_iterator<mocker::nasm::Line>::_List_const_iterator
            ((_List_const_iterator<mocker::nasm::Line> *)
             &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->funcBeg)._M_node;
  while (bVar2 = std::operator!=((_Self *)&inst.
                                           super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount,&this->funcEnd), bVar2) {
    std::_List_const_iterator<mocker::nasm::Line>::operator->
              ((_List_const_iterator<mocker::nasm::Line> *)
               &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)local_30);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar2) {
      peVar6 = std::
               __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      OVar5 = nasm::BinaryInst::getType(peVar6);
      if (OVar5 != Sub) goto LAB_00181b5f;
      peVar6 = std::
               __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      nasm::BinaryInst::getLhs(peVar6);
      nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
                ((shared_ptr<mocker::nasm::Addr> *)&baseOffset);
      peVar12 = std::
                __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&baseOffset);
      __lhs = nasm::Register::getIdentifier_abi_cxx11_(peVar12);
      this_03 = (__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)nasm::rsp();
      peVar12 = std::
                __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_03);
      __rhs = nasm::Register::getIdentifier_abi_cxx11_(peVar12);
      _Var3 = std::operator==(__lhs,__rhs);
      if (_Var3) {
        reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._0_4_ = 2;
      }
      else {
        reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._0_4_ = 0;
      }
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                ((shared_ptr<mocker::nasm::Register> *)&baseOffset);
    }
    else {
LAB_00181b5f:
      reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 4;
    }
    std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
              ((shared_ptr<mocker::nasm::BinaryInst> *)local_30);
    if (((int)reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != 0) &&
       ((int)reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == 2)) break;
    std::_List_const_iterator<mocker::nasm::Line>::operator++
              ((_List_const_iterator<mocker::nasm::Line> *)
               &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
  ::unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
                   *)&inst_1.
                      super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  bVar2 = std::operator!=((_Self *)&inst.
                                    super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,&this->funcEnd);
  if (bVar2) {
    std::_List_const_iterator<mocker::nasm::Line>::operator->
              ((_List_const_iterator<mocker::nasm::Line> *)
               &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)local_a0);
    peVar6 = std::
             __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
    nasm::BinaryInst::getRhs(peVar6);
    nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
              ((shared_ptr<mocker::nasm::Addr> *)&alignSz);
    this_04 = std::
              __shared_ptr_access<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&alignSz);
    nasm::NumericConstant::getVal(this_04);
    std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr
              ((shared_ptr<mocker::nasm::NumericConstant> *)&alignSz);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::size(toBeSpilled);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::size(toBeSpilled);
    pLVar11 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                        ((_List_const_iterator<mocker::nasm::Line> *)
                         &inst.
                          super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    std::__cxx11::string::string((string *)&pos,(string *)pLVar11);
    newSubRsp.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    LVar13 = nasm::Section::erase
                       (this->section,
                        (LineIter)
                        inst.
                        super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    local_fc._0_4_ = 4;
    psVar9 = (shared_ptr<mocker::nasm::NumericConstant> *)nasm::rsp();
    std::make_shared<mocker::nasm::NumericConstant,long&>((long *)&local_110);
    std::
    make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
              ((OpType *)(local_fc + 4),(shared_ptr<mocker::nasm::Register> *)local_fc,psVar9);
    std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr(&local_110);
    pSVar1 = this->section;
    local_118 = LVar13;
    std::__cxx11::string::string((string *)&local_168,(string *)&pos);
    std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::BinaryInst,void>
              ((shared_ptr<mocker::nasm::Inst> *)&alignSz_1,
               (shared_ptr<mocker::nasm::BinaryInst> *)(local_fc + 4));
    nasm::Line::Line(&local_148,&local_168,(shared_ptr<mocker::nasm::Inst> *)&alignSz_1);
    nasm::Section::appendLine(pSVar1,local_118,&local_148);
    nasm::Line::~Line(&local_148);
    std::shared_ptr<mocker::nasm::Inst>::~shared_ptr((shared_ptr<mocker::nasm::Inst> *)&alignSz_1);
    std::__cxx11::string::~string((string *)&local_168);
    std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
              ((shared_ptr<mocker::nasm::BinaryInst> *)(local_fc + 4));
    std::__cxx11::string::~string((string *)&pos);
    std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
              ((shared_ptr<mocker::nasm::BinaryInst> *)local_a0);
  }
  else {
    inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->funcBeg)._M_node;
    while (bVar2 = std::operator!=((_Self *)&inst.
                                             super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount,&this->funcEnd), bVar2) {
      pLVar11 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                          ((_List_const_iterator<mocker::nasm::Line> *)
                           &inst.
                            super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pLVar11->inst);
      if (bVar2) break;
      std::_List_const_iterator<mocker::nasm::Line>::operator++
                ((_List_const_iterator<mocker::nasm::Line> *)
                 &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    this_00 = &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::_List_const_iterator<mocker::nasm::Line>::operator++
              ((_List_const_iterator<mocker::nasm::Line> *)this_00);
    std::_List_const_iterator<mocker::nasm::Line>::operator++
              ((_List_const_iterator<mocker::nasm::Line> *)this_00);
    sVar7 = std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::size(toBeSpilled);
    sVar8 = std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::size(toBeSpilled);
    newSubRsp_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((sVar7 * 8 - (ulong)(((uint)sVar8 & 1) << 3)) + 0x10);
    local_194._0_4_ = 4;
    psVar9 = (shared_ptr<mocker::nasm::NumericConstant> *)nasm::rsp();
    std::make_shared<mocker::nasm::NumericConstant,long&>((long *)&local_1a8);
    std::
    make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
              ((OpType *)(local_194 + 4),(shared_ptr<mocker::nasm::Register> *)local_194,psVar9);
    std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr(&local_1a8);
    pSVar1 = this->section;
    local_1b0._M_node =
         (_List_node_base *)
         inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_201);
    std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::BinaryInst,void>
              ((shared_ptr<mocker::nasm::Inst> *)&i,
               (shared_ptr<mocker::nasm::BinaryInst> *)(local_194 + 4));
    nasm::Line::Line(&local_1e0,&local_200,(shared_ptr<mocker::nasm::Inst> *)&i);
    nasm::Section::appendLine(pSVar1,local_1b0,&local_1e0);
    nasm::Line::~Line(&local_1e0);
    std::shared_ptr<mocker::nasm::Inst>::~shared_ptr((shared_ptr<mocker::nasm::Inst> *)&i);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
              ((shared_ptr<mocker::nasm::BinaryInst> *)(local_194 + 4));
  }
  sz = 0;
  local_228 = std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::size(toBeSpilled);
  for (; sz < local_228; sz = sz + 1) {
    __args_1 = nasm::rbp();
    std::
    make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
              ((shared_ptr<mocker::nasm::Register> *)&local_238,(unsigned_long *)__args_1);
    __k = std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::operator[](toBeSpilled,sz);
    pmVar10 = std::
              unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
              ::operator[]((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
                            *)&inst_1.
                               super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,__k);
    std::shared_ptr<mocker::nasm::MemoryAddr>::operator=(pmVar10,&local_238);
    std::shared_ptr<mocker::nasm::MemoryAddr>::~shared_ptr(&local_238);
  }
  newVReg.vRegCnt = (size_t *)0x0;
  lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  _M_size = (size_t)&newVReg;
  std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::list
            ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
             &s._M_h._M_single_bucket);
  __first = std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::begin(toBeSpilled);
  __last = std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::end(toBeSpilled);
  this_01 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
            ((long)&inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 5);
  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(this_01);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
  ::
  unordered_set<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>const*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
            ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
              *)local_2a0,
             (__normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
              )__first._M_current,
             (__normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
              )__last._M_current,0,
             (hasher *)
             ((long)&inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),
             (key_equal *)
             ((long)&inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 6),this_01);
  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
            ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
             ((long)&inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->funcBeg)._M_node;
  while (bVar2 = std::operator!=((_Self *)&inst.
                                           super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount,&this->funcEnd), bVar2) {
    pLVar11 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                        ((_List_const_iterator<mocker::nasm::Line> *)
                         &inst.
                          super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    std::shared_ptr<mocker::nasm::Inst>::shared_ptr
              ((shared_ptr<mocker::nasm::Inst> *)&mp._M_h._M_single_bucket,&pLVar11->inst);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&mp._M_h._M_single_bucket);
    if (bVar2) {
      std::
      unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
      ::unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                       *)&__range3);
      nasm::getInvolvedRegs
                ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  *)&__begin3,(shared_ptr<mocker::nasm::Inst> *)&mp._M_h._M_single_bucket);
      __end3 = std::
               vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        *)&__begin3);
      reg_1 = (shared_ptr<mocker::nasm::Register> *)
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&__begin3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                         *)&reg_1), bVar2) {
        local_338 = (__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                       ::operator*(&__end3);
        bVar2 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                          ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            *)local_2a0,(shared_ptr<mocker::nasm::Register> *)local_338);
        if (bVar2) {
          peVar12 = std::
                    __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(local_338);
          nasm::Register::getIdentifier_abi_cxx11_(peVar12);
          rewriteProgram::anon_class_8_1_7726072b::operator()
                    ((anon_class_8_1_7726072b *)&__range3_1,
                     (string *)
                     &lines.
                      super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
                      _M_impl._M_node._M_size);
          this_05 = std::
                    unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                    ::operator[]((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                                  *)&__range3,(key_type *)local_338);
          std::shared_ptr<mocker::nasm::Register>::operator=
                    (this_05,(shared_ptr<mocker::nasm::Register> *)&__range3_1);
          std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Register> *)&__range3_1);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
        ::operator++(&__end3);
      }
      reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0xe;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)&__begin3);
      nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         *)&__begin3_1,(shared_ptr<mocker::nasm::Inst> *)&mp._M_h._M_single_bucket);
      __end3_1 = std::
                 vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          *)&__begin3_1);
      reg_2 = (shared_ptr<mocker::nasm::Register> *)
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&__begin3_1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                 *)&reg_2), bVar2) {
        x = __gnu_cxx::
            __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
            ::operator*(&__end3_1);
        bVar2 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                          ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            *)local_2a0,x);
        if (bVar2) {
          __args_1_00 = (shared_ptr<mocker::nasm::MemoryAddr> *)
                        std::
                        unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                        ::at((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                              *)&__range3,x);
          std::
          unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
          ::at((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
                *)&inst_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,x);
          std::
          make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::MemoryAddr>&>
                    ((shared_ptr<mocker::nasm::Register> *)
                     &newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,__args_1_00);
          std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
          emplace_back<std::shared_ptr<mocker::nasm::Mov>&>
                    ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                     &s._M_h._M_single_bucket,
                     (shared_ptr<mocker::nasm::Mov> *)
                     &newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<mocker::nasm::Mov>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Mov> *)
                     &newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
        ::operator++(&__end3_1);
      }
      reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0x10;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)&__begin3_1);
      nasm::replaceRegs((nasm *)&__range3_2,
                        (shared_ptr<mocker::nasm::Inst> *)&mp._M_h._M_single_bucket,
                        (RegMap<std::shared_ptr<Register>_> *)&__range3);
      pLVar11 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                          ((_List_const_iterator<mocker::nasm::Line> *)
                           &inst.
                            super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
      std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
      emplace_back<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                 &s._M_h._M_single_bucket,&pLVar11->label,
                 (shared_ptr<mocker::nasm::Inst> *)&__range3_2);
      nasm::getDefinedRegs
                ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  *)&__begin3_2,(shared_ptr<mocker::nasm::Inst> *)&mp._M_h._M_single_bucket);
      __end3_2 = std::
                 vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          *)&__begin3_2);
      reg_3 = (shared_ptr<mocker::nasm::Register> *)
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&__begin3_2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                 *)&reg_3), bVar2) {
        storeBack.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                ::operator*(&__end3_2);
        bVar2 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                          ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            *)local_2a0,
                           (shared_ptr<mocker::nasm::Register> *)
                           storeBack.
                           super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
        if (bVar2) {
          pmVar10 = std::
                    unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
                    ::at((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
                          *)&inst_1.
                             super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,
                         (key_type *)
                         storeBack.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
          std::
          unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
          ::at((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                *)&__range3,
               (key_type *)
               storeBack.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
          std::
          make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Register>&>
                    ((shared_ptr<mocker::nasm::MemoryAddr> *)local_3e8,
                     (shared_ptr<mocker::nasm::Register> *)pmVar10);
          std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
          emplace_back<std::shared_ptr<mocker::nasm::Mov>&>
                    ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                     &s._M_h._M_single_bucket,(shared_ptr<mocker::nasm::Mov> *)local_3e8);
          std::shared_ptr<mocker::nasm::Mov>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Mov> *)local_3e8);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
        ::operator++(&__end3_2);
      }
      reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0x12;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)&__begin3_2);
      std::shared_ptr<mocker::nasm::Inst>::~shared_ptr
                ((shared_ptr<mocker::nasm::Inst> *)&__range3_2);
      std::
      unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
      ::~unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                        *)&__range3);
      reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0;
    }
    else {
      __args = std::_List_const_iterator<mocker::nasm::Line>::operator*
                         ((_List_const_iterator<mocker::nasm::Line> *)
                          &inst.
                           super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
      emplace_back<mocker::nasm::Line_const&>
                ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                 &s._M_h._M_single_bucket,__args);
      reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0xd;
    }
    std::shared_ptr<mocker::nasm::Inst>::~shared_ptr
              ((shared_ptr<mocker::nasm::Inst> *)&mp._M_h._M_single_bucket);
    std::_List_const_iterator<mocker::nasm::Line>::operator++
              ((_List_const_iterator<mocker::nasm::Line> *)
               &inst.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  LVar13 = nasm::Section::erase(this->section,(this->funcBeg)._M_node,(this->funcEnd)._M_node);
  (this->funcEnd)._M_node = LVar13._M_node;
  (this->funcBeg)._M_node = (this->funcEnd)._M_node;
  bVar2 = false;
  this_02 = &s._M_h._M_single_bucket;
  __end2 = std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::begin
                     ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)this_02);
  line = (Line *)std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::end
                           ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)this_02
                           );
  while (bVar4 = std::operator!=(&__end2,(_Self *)&line), bVar4) {
    local_428 = std::_List_iterator<mocker::nasm::Line>::operator*(&__end2);
    pSVar1 = this->section;
    local_430._M_node = (this->funcEnd)._M_node;
    nasm::Line::Line(&local_460,local_428);
    nasm::Section::appendLine(pSVar1,local_430,&local_460);
    nasm::Line::~Line(&local_460);
    if (!bVar2) {
      bVar2 = true;
      std::_List_const_iterator<mocker::nasm::Line>::operator--(&this->funcBeg);
    }
    std::_List_iterator<mocker::nasm::Line>::operator++(&__end2);
  }
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_2a0);
  std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::~list
            ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
             &s._M_h._M_single_bucket);
  std::
  unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
  ::~unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>_>
                    *)&inst_1.
                       super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  return;
}

Assistant:

void RegisterAllocator::rewriteProgram(const std::vector<Node> &toBeSpilled) {
  // find sub rsp
  LineIter iter;
  for (iter = funcBeg; iter != funcEnd; ++iter) {
    auto inst = nasm::dyc<nasm::BinaryInst>(iter->inst);
    if (!inst || inst->getType() != nasm::BinaryInst::Sub)
      continue;
    auto reg = nasm::dyc<nasm::Register>(inst->getLhs());
    if (reg->getIdentifier() == nasm::rsp()->getIdentifier())
      break;
  }

  std::size_t baseOffset = 0;
  RegMap<std::shared_ptr<nasm::MemoryAddr>> offsets;

  // An sub-rsp instruction exists
  if (iter != funcEnd) {
    auto inst = nasm::dyc<nasm::BinaryInst>(iter->inst);
    baseOffset = nasm::dyc<nasm::NumericConstant>(inst->getRhs())->getVal();
    int64_t alignSz = baseOffset + 8 * toBeSpilled.size() +
                      (16 - (8 * toBeSpilled.size()) % 16);
    auto label = iter->label;
    auto pos = section.erase(iter);
    auto newSubRsp = std::make_shared<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));
    section.appendLine(pos, nasm::Line(label, newSubRsp));

  } else {
    for (iter = funcBeg; iter != funcEnd; ++iter) {
      if (iter->inst)
        break;
    }
    // The first two instructions of a function are always
    // push  %rbp
    // mov   %rbp, %rsp
    ++iter;
    ++iter;
    int64_t alignSz = baseOffset + 8 * toBeSpilled.size() +
                      (16 - (8 * toBeSpilled.size()) % 16);
    auto newSubRsp = std::make_shared<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));
    section.appendLine(iter, nasm::Line("", newSubRsp));
  }

  for (std::size_t i = 0, sz = toBeSpilled.size(); i < sz; ++i) {
    offsets[toBeSpilled[i]] = std::make_shared<nasm::MemoryAddr>(
        nasm::rbp(), -((int)baseOffset + 8 * (i + 1)));
  }

  std::size_t vRegCnt = 0;
  auto newVReg = [&vRegCnt](const std::string &hint) {
    return std::make_shared<nasm::Register>(hint + "_" +
                                            std::to_string(vRegCnt++));
  };
  std::list<nasm::Line> lines;
  RegSet s(toBeSpilled.begin(), toBeSpilled.end());
  for (iter = funcBeg; iter != funcEnd; ++iter) {
    auto inst = iter->inst;
    if (!inst) {
      lines.emplace_back(*iter);
      continue;
    }
    RegMap<Node> mp;
    for (auto &reg : nasm::getInvolvedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      mp[reg] = newVReg(reg->getIdentifier());
    }
    for (auto &reg : nasm::getUsedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      auto load = std::make_shared<nasm::Mov>(mp.at(reg), offsets.at(reg));
      lines.emplace_back(load);
    }
    auto newInst = nasm::replaceRegs(inst, mp);
    lines.emplace_back(iter->label, newInst);
    for (auto &reg : nasm::getDefinedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      auto storeBack = std::make_shared<nasm::Mov>(offsets.at(reg), mp.at(reg));
      lines.emplace_back(storeBack);
    }
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  bool flag = false;
  for (auto &line : lines) {
    section.appendLine(funcEnd, std::move(line));
    if (!flag) {
      flag = true;
      --funcBeg;
    }
  }
}